

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReproduceListener.cpp
# Opt level: O0

void __thiscall rc::detail::ReproduceListener::~ReproduceListener(ReproduceListener *this)

{
  bool bVar1;
  ostream *poVar2;
  string local_38;
  uint local_14;
  ReproduceListener *local_10;
  ReproduceListener *this_local;
  
  (this->super_TestListenerAdapter).super_TestListener._vptr_TestListener =
       (_func_int **)&PTR_onTestCaseFinished_002822d8;
  local_10 = this;
  bVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
          ::empty(&this->m_reproduceMap);
  if (!bVar1) {
    poVar2 = std::operator<<(this->m_out,"Some of your RapidCheck properties had failures. To ");
    poVar2 = std::operator<<(poVar2,"reproduce these, run with:");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"RC_PARAMS=\"reproduce=");
    reproduceMapToString(&local_38,&this->m_reproduceMap);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_38);
  }
  local_14 = (uint)bVar1;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
  ::~unordered_map(&this->m_reproduceMap);
  TestListenerAdapter::~TestListenerAdapter(&this->super_TestListenerAdapter);
  return;
}

Assistant:

ReproduceListener::~ReproduceListener() {
  if (m_reproduceMap.empty()) {
    return;
  }

  m_out << "Some of your RapidCheck properties had failures. To "
        << "reproduce these, run with:" << std::endl
        << "RC_PARAMS=\"reproduce=" << reproduceMapToString(m_reproduceMap)
        << "\"" << std::endl;
}